

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O1

void __thiscall
S2EdgeTessellator::AppendProjected
          (S2EdgeTessellator *this,S2Point *a,S2Point *b,
          vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *vertices)

{
  double *pdVar1;
  double dVar2;
  iterator __position;
  long lVar3;
  bool bVar4;
  VType extraout_XMM0_Qa;
  double in_XMM1_Qa;
  R2Point pb;
  R2Point local_60;
  R2Point local_50;
  S2LogMessage local_40;
  
  (*this->proj_->_vptr_Projection[2])();
  local_60.c_[1] = in_XMM1_Qa;
  local_60.c_[0] = extraout_XMM0_Qa;
  __position._M_current = *(Vector2<double> **)(vertices + 8);
  if (*(Vector2<double> **)vertices == __position._M_current) {
    if (__position._M_current == *(Vector2<double> **)(vertices + 0x10)) {
      std::vector<Vector2<double>,std::allocator<Vector2<double>>>::
      _M_realloc_insert<Vector2<double>const&>
                ((vector<Vector2<double>,std::allocator<Vector2<double>>> *)vertices,__position,
                 &local_60);
    }
    else {
      (__position._M_current)->c_[0] = extraout_XMM0_Qa;
      (__position._M_current)->c_[1] = in_XMM1_Qa;
      *(long *)(vertices + 8) = *(long *)(vertices + 8) + 0x10;
    }
  }
  else {
    local_60 = S2::Projection::WrapDestination(this->proj_,__position._M_current + -1,&local_60);
    in_XMM1_Qa = *(double *)(*(long *)(vertices + 8) + -0x10);
    if ((in_XMM1_Qa == local_60.c_[0]) && (!NAN(in_XMM1_Qa) && !NAN(local_60.c_[0]))) {
      lVar3 = 0;
      do {
        bVar4 = lVar3 == 8;
        if (bVar4) goto LAB_001f150a;
        dVar2 = *(double *)(*(long *)(vertices + 8) + -8 + lVar3);
        pdVar1 = (double *)((long)local_60.c_ + lVar3 + 8);
        lVar3 = lVar3 + 8;
      } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
    }
    bVar4 = false;
LAB_001f150a:
    if (!bVar4) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_tessellator.cc"
                 ,0xda,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Check failed: (vertices->back()) == (pa) ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Appended edges must form a chain",0x20);
      abort();
    }
  }
  (*this->proj_->_vptr_Projection[2])(this->proj_,b);
  local_50.c_[1] = in_XMM1_Qa;
  AppendProjected(this,&local_60,a,&local_50,b,vertices);
  return;
}

Assistant:

void S2EdgeTessellator::AppendProjected(
    const S2Point& a, const S2Point& b, vector<R2Point>* vertices) const {
  R2Point pa = proj_.Project(a);
  if (vertices->empty()) {
    vertices->push_back(pa);
  } else {
    pa = proj_.WrapDestination(vertices->back(), pa);
    S2_DCHECK_EQ(vertices->back(), pa) << "Appended edges must form a chain";
  }
  R2Point pb = proj_.Project(b);
  AppendProjected(pa, a, pb, b, vertices);
}